

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  lconv *plVar5;
  uchar *puVar6;
  ulong uVar7;
  cJSON_bool cVar8;
  uchar uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  double dVar11;
  double test;
  uchar number_buffer [26];
  double local_60;
  undefined8 local_58;
  undefined2 uStack_50;
  undefined6 local_4e;
  undefined2 uStack_48;
  undefined8 uStack_46;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = item->valuedouble;
  uStack_48 = 0;
  uStack_46 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_4e = 0;
  plVar5 = localeconv();
  uVar2 = *plVar5->decimal_point;
  local_60 = 0.0;
  cVar8 = 0;
  if (output_buffer == (printbuffer *)0x0) goto LAB_001062fa;
  if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
    uVar3 = sprintf((char *)&local_58,"%1.15g");
    iVar4 = __isoc99_sscanf(&local_58,"%lg",&local_60);
    if (iVar4 == 1) {
      dVar11 = ABS(local_60);
      if (ABS(local_60) <= ABS(dVar1)) {
        dVar11 = ABS(dVar1);
      }
      if (ABS(local_60 - dVar1) <= dVar11 * 2.220446049250313e-16) goto LAB_001062b0;
    }
    uVar3 = sprintf((char *)&local_58,"%1.17g");
  }
  else {
    uVar10 = (ulong)local_58 >> 0x20;
    local_58 = CONCAT44((uint)uVar10 & 0xffffff00,0x6c6c756e);
    uVar3 = 4;
  }
LAB_001062b0:
  cVar8 = 0;
  if (uVar3 < 0x1a) {
    uVar10 = (ulong)uVar3;
    puVar6 = ensure(output_buffer,uVar10 + 1);
    if (puVar6 != (uchar *)0x0) {
      uVar7 = 0;
      if (uVar3 != 0) {
        do {
          uVar9 = *(uchar *)((long)&local_58 + uVar7);
          if (*(uchar *)((long)&local_58 + uVar7) == uVar2) {
            uVar9 = '.';
          }
          puVar6[uVar7] = uVar9;
          uVar7 = uVar7 + 1;
        } while (uVar10 != uVar7);
      }
      puVar6[uVar7] = '\0';
      output_buffer->offset = output_buffer->offset + uVar10;
      cVar8 = 1;
    }
  }
LAB_001062fa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return cVar8;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26] = {0}; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test = 0.0;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if (isnan(d) || isinf(d))
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || !compare_double((double)test, d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}